

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_zip.cpp
# Opt level: O0

DWORD Zip_FindCentralDir(FileReader *fin)

{
  DWORD DVar1;
  uint b;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int local_434;
  int i;
  DWORD uReadPos;
  DWORD uReadSize;
  DWORD uPosFound;
  DWORD uMaxBack;
  DWORD uBackRead;
  DWORD FileSize;
  uchar buf [1028];
  FileReader *fin_local;
  
  uReadPos = 0;
  unique0x100001d9 = fin;
  (*(fin->super_FileReaderBase)._vptr_FileReaderBase[4])(fin,0,2);
  b = (*(stack0xfffffffffffffff0->super_FileReaderBase)._vptr_FileReaderBase[3])();
  uVar2 = MIN<unsigned_int>(0xffff,b);
  uPosFound = 4;
  do {
    if (uVar2 <= uPosFound) {
      return uReadPos;
    }
    DVar1 = uVar2;
    if (uPosFound + 0x400 <= uVar2) {
      DVar1 = uPosFound + 0x400;
    }
    uPosFound = DVar1;
    uVar3 = b - uPosFound;
    uVar4 = MIN<unsigned_int>(0x404,b - uVar3);
    iVar5 = (*(stack0xfffffffffffffff0->super_FileReaderBase)._vptr_FileReaderBase[4])
                      (stack0xfffffffffffffff0,(ulong)uVar3,0);
    if (CONCAT44(extraout_var,iVar5) != 0) {
      return uReadPos;
    }
    iVar5 = (*(stack0xfffffffffffffff0->super_FileReaderBase)._vptr_FileReaderBase[2])
                      (stack0xfffffffffffffff0,&uBackRead,(long)(int)uVar4);
    if (CONCAT44(extraout_var_00,iVar5) != (long)(int)uVar4) {
      return uReadPos;
    }
    iVar5 = uVar4 - 3;
    do {
      local_434 = iVar5;
      iVar5 = local_434 + -1;
      if (local_434 < 1) goto LAB_00829dd0;
    } while ((((*(char *)((long)&uBackRead + (long)iVar5) != 'P') ||
              (*(char *)((long)&uBackRead + (long)local_434) != 'K')) ||
             (*(char *)((long)&uBackRead + (long)(local_434 + 1)) != '\x05')) ||
            (*(char *)((long)&uBackRead + (long)(local_434 + 2)) != '\x06'));
    uReadPos = uVar3 + iVar5;
LAB_00829dd0:
    if (uReadPos != 0) {
      return uReadPos;
    }
  } while( true );
}

Assistant:

static DWORD Zip_FindCentralDir(FileReader * fin)
{
	unsigned char buf[BUFREADCOMMENT + 4];
	DWORD FileSize;
	DWORD uBackRead;
	DWORD uMaxBack; // maximum size of global comment
	DWORD uPosFound=0;

	fin->Seek(0, SEEK_END);

	FileSize = fin->Tell();
	uMaxBack = MIN<DWORD>(0xffff, FileSize);

	uBackRead = 4;
	while (uBackRead < uMaxBack)
	{
		DWORD uReadSize, uReadPos;
		int i;
		if (uBackRead + BUFREADCOMMENT > uMaxBack) 
			uBackRead = uMaxBack;
		else
			uBackRead += BUFREADCOMMENT;
		uReadPos = FileSize - uBackRead;

		uReadSize = MIN<DWORD>((BUFREADCOMMENT + 4), (FileSize - uReadPos));

		if (fin->Seek(uReadPos, SEEK_SET) != 0) break;

		if (fin->Read(buf, (SDWORD)uReadSize) != (SDWORD)uReadSize) break;

		for (i = (int)uReadSize - 3; (i--) > 0;)
		{
			if (buf[i] == 'P' && buf[i+1] == 'K' && buf[i+2] == 5 && buf[i+3] == 6)
			{
				uPosFound = uReadPos + i;
				break;
			}
		}

		if (uPosFound != 0)
			break;
	}
	return uPosFound;
}